

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task18.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char local_2a [2];
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar5 = -100;
  iVar6 = 100;
  lVar7 = 0x50;
  do {
    iVar1 = rand();
    iVar1 = iVar1 % 0xc9 + -100;
    if (iVar1 <= iVar6) {
      iVar6 = iVar1;
    }
    if (iVar5 <= iVar1) {
      iVar5 = iVar1;
    }
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    local_2a[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
    lVar7 = lVar7 + -4;
  } while (lVar7 != 0);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
  local_2a[1] = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a + 1,1);
  plVar4 = (long *)std::ostream::operator<<(poVar3,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(){
    int array[20] = {};
    int min = 100, max = -100;
    srand(time(NULL)); // сид для генерации задаем текущим верменем
    for (int &num: array){
        num = rand() % 201 - 100; // получаем числа в [0 - 100; 200 - 100]
        if (min > num) min = num;
        if (max < num) max = num;
        cout << num << ' ';
    }
    cout << endl << min << ' ' << max << endl;
    return 0;
}